

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::on_connection_complete(peer_connection *this,error_code *e)

{
  undefined1 *puVar1;
  socket_type *__variants;
  int iVar2;
  torrent_peer *ptVar3;
  long lVar4;
  session_interface *psVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  uchar auVar8 [8];
  uchar auVar9 [8];
  byte bVar10;
  int iVar11;
  uint v;
  time_point tVar12;
  string *psVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  endpoint *ep;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar14;
  _List_node_base *p_Var15;
  undefined8 uVar16;
  bool bVar17;
  error_code eVar18;
  error_code ec;
  undefined1 local_70 [32];
  error_code local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar11 = this_00->_M_use_count;
    do {
      if (iVar11 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = this_00->_M_use_count;
      bVar17 = iVar11 == iVar2;
      if (bVar17) {
        this_00->_M_use_count = iVar11 + 1;
        iVar2 = iVar11;
      }
      iVar11 = iVar2;
      UNLOCK();
    } while (!bVar17);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar17 = true;
  }
  else {
    bVar17 = this_00->_M_use_count == 0;
  }
  if (bVar17) {
    peVar14 = (element_type *)0x0;
  }
  else {
    peVar14 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    if ((peVar14 != (element_type *)0x0) &&
       (ptVar3 = this->m_peer_info, peVar14->m_num_connecting = peVar14->m_num_connecting - 1,
       (ptVar3->field_0x1b & 0x80) != 0)) {
      peVar14->m_num_connecting_seeds = peVar14->m_num_connecting_seeds - 1;
    }
    puVar1 = &(this->super_peer_connection_hot_members).field_0x28;
    *puVar1 = *puVar1 & 0xfd;
  }
  auVar9[4] = local_70[0xc];
  auVar9[5] = local_70[0xd];
  auVar9[6] = local_70[0xe];
  auVar9[7] = local_70[0xf];
  auVar9[0] = local_70[8];
  auVar9[1] = local_70[9];
  auVar9[2] = local_70[10];
  auVar9[3] = local_70[0xb];
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_002514c0;
  if (e->failed_ == true) {
    connect_failed(this,e);
    auVar9[4] = local_70[0xc];
    auVar9[5] = local_70[0xd];
    auVar9[6] = local_70[0xe];
    auVar9[7] = local_70[0xf];
    auVar9[0] = local_70[8];
    auVar9[1] = local_70[9];
    auVar9[2] = local_70[10];
    auVar9[3] = local_70[0xb];
    goto LAB_002514c0;
  }
  this->field_0x885 = this->field_0x885 | 0x80;
  counters::inc_stats_counter(this->m_counters,0xe6,1);
  auVar9[4] = local_70[0xc];
  auVar9[5] = local_70[0xd];
  auVar9[6] = local_70[0xe];
  auVar9[7] = local_70[0xf];
  auVar9[0] = local_70[8];
  auVar9[1] = local_70[9];
  auVar9[2] = local_70[10];
  auVar9[3] = local_70[0xb];
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_002514c0;
  lVar4 = (this->m_connect).__d.__r;
  tVar12 = time_now();
  auVar6 = SEXT816((long)tVar12.__d.__r - lVar4) * SEXT816(0x431bde82d7b634db);
  (this->m_last_receive).m_time_diff.__r = (int)(auVar6._8_8_ >> 0x12) - (auVar6._12_4_ >> 0x1f);
  local_50.val_ = 0;
  local_50.failed_ = false;
  local_50.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  __variants = &this->m_socket;
  local_40._M_allocated_capacity = (size_type)&local_50;
  ::std::
  visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
            ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__polymorphic_socket_hpp:62:5),_const_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
              *)local_70,(anon_class_8_1_3fcf655c *)&local_40._M_allocated_capacity,
             &__variants->
              super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
            );
  auVar8[4] = local_70[0xc];
  auVar8[5] = local_70[0xd];
  auVar8[6] = local_70[0xe];
  auVar8[7] = local_70[0xf];
  auVar8[0] = local_70[8];
  auVar8[1] = local_70[9];
  auVar8[2] = local_70[10];
  auVar8[3] = local_70[0xb];
  *(ulong *)((long)&(this->m_local).impl_.data_ + 0xc) = CONCAT44(local_70._16_4_,local_70._12_4_);
  *(ulong *)((long)&(this->m_local).impl_.data_ + 0x14) = CONCAT44(local_70._24_4_,local_70._20_4_);
  *(undefined8 *)&(this->m_local).impl_.data_ = local_70._0_8_;
  *(uchar (*) [8])((long)&(this->m_local).impl_.data_ + 8) = auVar8;
  bVar10 = 4;
  if (local_50.failed_ == false) {
    psVar13 = session_settings::get_str_abi_cxx11_
                        ((this->super_peer_connection_hot_members).m_settings,4);
    if (psVar13->_M_string_length != 0) {
      local_70[0] = (this->m_local).impl_.data_.base.sa_family != 2;
      if ((bool)local_70[0]) {
        uVar16 = *(undefined8 *)((long)&(this->m_local).impl_.data_ + 8);
        uVar7 = *(undefined8 *)((long)&(this->m_local).impl_.data_ + 0x10);
        local_70._8_4_ = (undefined4)uVar16;
        local_70._12_4_ = (undefined4)((ulong)uVar16 >> 0x20);
        local_70._16_4_ = (undefined4)uVar7;
        local_70._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        local_70._24_4_ = (this->m_local).impl_.data_.v6.sin6_scope_id;
        local_70._4_4_ = 0;
      }
      else {
        local_70._4_4_ = (this->m_local).impl_.data_.v6.sin6_flowinfo;
        local_70._8_4_ = 0;
        local_70._12_4_ = 0;
        local_70._16_4_ = 0;
        local_70._20_4_ = 0;
        local_70._24_4_ = 0;
      }
      local_70._28_4_ = 0;
      local_70._1_3_ = 0;
      psVar5 = (this->super_peer_connection_hot_members).m_ses;
      bVar17 = is_utp(__variants);
      iVar11 = (*(psVar5->super_session_logger)._vptr_session_logger[0x26])
                         (psVar5,local_70,(ulong)bVar17,&local_50);
      auVar8[4] = local_70[0xc];
      auVar8[5] = local_70[0xd];
      auVar8[6] = local_70[0xe];
      auVar8[7] = local_70[0xf];
      auVar8[0] = local_70[8];
      auVar8[1] = local_70[9];
      auVar8[2] = local_70[10];
      auVar8[3] = local_70[0xb];
      if ((char)iVar11 == '\0') {
        bVar10 = 0x12;
        if (local_50.failed_ == false) {
          local_70._0_4_ = 0x13;
          local_70[4] = 1;
          local_70._8_4_ = 0x4ee510;
          local_70._12_4_ = 0;
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_70,0x10,0);
          auVar9[4] = local_70[0xc];
          auVar9[5] = local_70[0xd];
          auVar9[6] = local_70[0xe];
          auVar9[7] = local_70[0xf];
          auVar9[0] = local_70[8];
          auVar9[1] = local_70[9];
          auVar9[2] = local_70[10];
          auVar9[3] = local_70[0xb];
          goto LAB_002514c0;
        }
        goto LAB_002514a9;
      }
    }
    bVar17 = is_utp(__variants);
    if ((bVar17) && (this->m_peer_info != (torrent_peer *)0x0)) {
      puVar1 = &this->m_peer_info->field_0x1e;
      *puVar1 = *puVar1 | 0x20;
      puVar1 = &this->m_peer_info->field_0x1b;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xefffffff;
    }
    received_synack(this,(this->m_remote).impl_.data_.base.sa_family != 2);
    iVar11 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    uVar16 = &this->m_remote;
    if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar11) + 0x68) < 0) {
      local_40._8_8_ = uVar16;
      print_endpoint_abi_cxx11_((string *)local_70,(aux *)uVar16,ep);
      peer_log(this,outgoing,"COMPLETED","ep: %s",CONCAT44(local_70._4_4_,local_70._0_4_));
      uVar16 = local_40._8_8_;
      if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),
                        CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
        uVar16 = local_40._8_8_;
      }
    }
    peer_log(this,info,"SET_NON_BLOCKING","");
    local_40._M_local_buf[0] = 1;
    local_70._0_8_ = &local_40;
    local_70._8_8_ = &local_50;
    ::std::
    visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
              ((anon_class_16_2_7fa27073 *)local_70,
               &__variants->
                super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              );
    bVar10 = 2;
    auVar8 = (uchar  [8])local_70._8_8_;
    if (local_50.failed_ != true) {
      local_40._M_allocated_capacity = (size_type)&local_50;
      ::std::
      visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
                ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__polymorphic_socket_hpp:62:5),_const_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
                  *)local_70,(anon_class_8_1_3fcf655c *)&local_40._M_allocated_capacity,
                 &__variants->
                  super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                );
      bVar17 = boost::asio::ip::operator==
                         ((basic_endpoint<boost::asio::ip::tcp> *)uVar16,
                          (basic_endpoint<boost::asio::ip::tcp> *)local_70);
      if (bVar17) {
        eVar18 = errors::make_error_code(self_connection);
        local_70._0_4_ = eVar18.val_;
        local_70._4_4_ = eVar18._4_4_;
        local_70._8_4_ = eVar18.cat_._0_4_;
        local_70._12_4_ = eVar18.cat_._4_4_;
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_70,1,1);
        auVar9[4] = local_70[0xc];
        auVar9[5] = local_70[0xd];
        auVar9[6] = local_70[0xe];
        auVar9[7] = local_70[0xf];
        auVar9[0] = local_70[8];
        auVar9[1] = local_70[9];
        auVar9[2] = local_70[10];
        auVar9[3] = local_70[0xb];
      }
      else {
        iVar11 = session_settings::get_int
                           ((this->super_peer_connection_hot_members).m_settings,0x4028);
        if (iVar11 != 0) {
          v = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x4028)
          ;
          set_traffic_class<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                    (__variants,v,&local_50);
          if (local_50.failed_ == true) {
            iVar11 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar11) + 0x68) < 0) {
              (*((error_category *)&(local_50.cat_)->_vptr_error_category)->_vptr_error_category[4])
                        (local_70,local_50.cat_,(ulong)(uint)local_50.val_);
              peer_log(this,outgoing,"SET_DSCP","value: %d e: %s",(ulong)v,local_70._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_70 + 0x10)) {
                operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1
                               );
              }
            }
          }
        }
        p_Var15 = (_List_node_base *)&this->m_extensions;
        while (p_Var15 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                            *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var15 != (_List_node_base *)&this->m_extensions) {
          (**(code **)(*(long *)p_Var15[1]._M_next + 0x28))();
        }
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2e])(this);
        if ((*(ushort *)&this->field_0x885 >> 0xd & 1) != 0) {
          *(ushort *)&this->field_0x885 = *(ushort *)&this->field_0x885 & 0xdfff;
          send_block_requests_impl(this);
        }
        setup_receive(this);
        setup_send(this);
        auVar9 = (uchar  [8])local_70._8_8_;
      }
      goto LAB_002514c0;
    }
  }
LAB_002514a9:
  local_70._8_8_ = auVar8;
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_50,(ulong)bVar10,0);
  auVar9 = (uchar  [8])local_70._8_8_;
LAB_002514c0:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_70._8_8_ = auVar9;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void peer_connection::on_connection_complete(error_code const& e)
	{
		TORRENT_ASSERT(is_single_thread());
		COMPLETE_ASYNC("peer_connection::on_connection_complete");

		INVARIANT_CHECK;

		// if t is nullptr, we better not be connecting, since
		// we can't decrement the connecting counter
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t || !m_connecting);
		if (m_connecting)
		{
			m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
			if (t) t->dec_num_connecting(m_peer_info);
			m_connecting = false;
		}

		if (m_disconnecting) return;

		if (e)
		{
			connect_failed(e);
			return;
		}

		TORRENT_ASSERT(!m_connected);
		m_connected = true;
		m_counters.inc_stats_counter(counters::num_peers_connected);

		if (m_disconnecting) return;
		m_last_receive.set(m_connect, aux::time_now());

		error_code ec;
		m_local = m_socket.local_endpoint(ec);
		if (ec)
		{
			disconnect(ec, operation_t::getname);
			return;
		}

		// if there are outgoing interfaces specified, verify this
		// peer is correctly bound to one of them
		if (!m_settings.get_str(settings_pack::outgoing_interfaces).empty())
		{
			if (!m_ses.verify_bound_address(m_local.address()
				, is_utp(m_socket), ec))
			{
				if (ec)
				{
					disconnect(ec, operation_t::get_interface);
					return;
				}
				disconnect(error_code(
					boost::system::errc::no_such_device, generic_category())
					, operation_t::connect);
				return;
			}
		}

		if (is_utp(m_socket) && m_peer_info)
		{
			m_peer_info->confirmed_supports_utp = true;
			m_peer_info->supports_utp = false;
		}

		// this means the connection just succeeded

		received_synack(aux::is_v6(m_remote));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing))
		{
			peer_log(peer_log_alert::outgoing, "COMPLETED"
				, "ep: %s", print_endpoint(m_remote).c_str());
		}
#endif

		// set the socket to non-blocking, so that we can
		// read the entire buffer on each read event we get
#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "SET_NON_BLOCKING");
#endif
		m_socket.non_blocking(true, ec);
		if (ec)
		{
			disconnect(ec, operation_t::iocontrol);
			return;
		}

		if (m_remote == m_socket.local_endpoint(ec)
#if TORRENT_USE_RTC
			// WebRTC connections are independant from the socket (their endpoints are not reliable anyway)
			&& !is_rtc(m_socket)
#endif
		)
		{
			disconnect(errors::self_connection, operation_t::bittorrent, failure);
			return;
		}

		if (m_settings.get_int(settings_pack::peer_dscp) != 0)
		{
			int const value = m_settings.get_int(settings_pack::peer_dscp);
			aux::set_traffic_class(m_socket, value, ec);
#ifndef TORRENT_DISABLE_LOGGING
			if (ec && should_log(peer_log_alert::outgoing))
			{
				peer_log(peer_log_alert::outgoing, "SET_DSCP", "value: %d e: %s"
					, value, ec.message().c_str());
			}
#endif
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			ext->on_connected();
		}
#endif

		on_connected();

		if (m_deferred_send_block_requests)
		{
			m_deferred_send_block_requests = false;
			send_block_requests_impl();
		}

		setup_receive();
		setup_send();
	}